

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O0

uchar core::image::desaturate_luminosity<unsigned_char>(uchar *v)

{
  uchar uVar1;
  uchar *v_local;
  
  uVar1 = math::interpolate<unsigned_char>(v,v + 1,v + 2,0.21,0.72,0.07);
  return uVar1;
}

Assistant:

inline T
desaturate_luminosity (T const* v)
{
    return math::interpolate(v[0], v[1], v[2], 0.21f, 0.72f, 0.07f);
}